

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::meshcoarsening(tetgenmesh *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  arraypool *this_00;
  char *pcVar5;
  uint local_74;
  uint local_4c;
  int i;
  int bak_fliplinklevel;
  int nit;
  long ms;
  point *plastpt;
  point *parypt;
  arraypool *remptlist;
  tetgenmesh *this_local;
  
  if (this->b->quiet == 0) {
    printf("Mesh coarsening ...\n");
  }
  this_00 = (arraypool *)operator_new(0x30);
  arraypool::arraypool(this_00,8,10);
  collectremovepoints(this,this_00);
  if (this_00->objects == 0) {
    if (this_00 != (arraypool *)0x0) {
      arraypool::~arraypool(this_00);
      operator_delete(this_00,0x30);
    }
  }
  else {
    if ((this->b->verbose != 0) && (0 < this_00->objects)) {
      printf("  Removing %ld points...\n",this_00->objects);
    }
    _bak_fliplinklevel = this_00->objects;
    i = 0;
    iVar1 = this->b->fliplinklevel;
    this->b->fliplinklevel = -1;
    this->autofliplinklevel = 1;
    while( true ) {
      if (1 < this->b->verbose) {
        pcVar5 = "auto";
        if (0 < this->b->fliplinklevel) {
          pcVar5 = "fixed";
        }
        if (this->b->fliplinklevel < 1) {
          local_74 = this->autofliplinklevel;
        }
        else {
          local_74 = this->b->fliplinklevel;
        }
        printf("    Removing points [%s level = %2d] #:  %ld.\n",pcVar5,(ulong)local_74,
               this_00->objects);
      }
      for (local_4c = 0; (long)(int)local_4c < this_00->objects; local_4c = local_4c + 1) {
        pcVar5 = this_00->toparray[(int)local_4c >> ((byte)this_00->log2objectsperblock & 0x1f)];
        uVar2 = this_00->objectsperblockmark;
        iVar3 = this_00->objectbytes;
        iVar4 = removevertexbyflips(this,*(point *)(pcVar5 + (int)((local_4c & uVar2) * iVar3)));
        if (iVar4 != 0) {
          *(undefined8 *)(pcVar5 + (int)((local_4c & uVar2) * iVar3)) =
               *(undefined8 *)
                (this_00->toparray
                 [this_00->objects + -1 >> ((byte)this_00->log2objectsperblock & 0x3f)] +
                (this_00->objects - 1U & (long)this_00->objectsperblockmark) *
                (long)this_00->objectbytes);
          this_00->objects = this_00->objects + -1;
          local_4c = local_4c - 1;
        }
      }
      if ((this_00->objects < 1) || (-1 < this->b->fliplinklevel)) break;
      if (this_00->objects == _bak_fliplinklevel) {
        i = i + 1;
        if (2 < i) {
          this->b->fliplinklevel = 100000;
        }
      }
      else {
        _bak_fliplinklevel = this_00->objects;
        if (0 < i) {
          i = i + -1;
        }
      }
      this->autofliplinklevel = this->b->fliplinklevelinc + this->autofliplinklevel;
    }
    if ((0 < this_00->objects) && (this->b->verbose != 0)) {
      printf("  %ld points are not removed !\n",this_00->objects);
    }
    this->b->fliplinklevel = iVar1;
    if (this_00 != (arraypool *)0x0) {
      arraypool::~arraypool(this_00);
      operator_delete(this_00,0x30);
    }
  }
  return;
}

Assistant:

void tetgenmesh::meshcoarsening()
{
  arraypool *remptlist;

  if (!b->quiet) {
    printf("Mesh coarsening ...\n");
  }

  // Collect the set of points to be removed
  remptlist = new arraypool(sizeof(point *), 10);
  collectremovepoints(remptlist);

  if (remptlist->objects == 0l) {
    delete remptlist;
    return;
  }

  if (b->verbose) {
    if (remptlist->objects > 0l) {
      printf("  Removing %ld points...\n", remptlist->objects);
    }
  }

  point *parypt, *plastpt;
  long ms = remptlist->objects;
  int nit = 0; 
  int bak_fliplinklevel = b->fliplinklevel;
  b->fliplinklevel = -1;
  autofliplinklevel = 1; // Init value.
  int i;

  while (1) {
  
    if (b->verbose > 1) {
      printf("    Removing points [%s level = %2d] #:  %ld.\n", 
             (b->fliplinklevel > 0) ? "fixed" : "auto",
             (b->fliplinklevel > 0) ? b->fliplinklevel : autofliplinklevel,
             remptlist->objects);
    }

    // Remove the list of points.
    for (i = 0; i < remptlist->objects; i++) {
      parypt = (point *) fastlookup(remptlist, i);
      if (removevertexbyflips(*parypt)) {
        // Move the last entry to the current place.
        plastpt = (point *) fastlookup(remptlist, remptlist->objects - 1);
        *parypt = *plastpt;
        remptlist->objects--;
        i--;
      }
    }

    if (remptlist->objects > 0l) {
      if (b->fliplinklevel >= 0) {
        break; // We have tried all levels.
      }
      if (remptlist->objects == ms) {
        nit++;
        if (nit >= 3) {
          // Do the last round with unbounded flip link level.
          b->fliplinklevel = 100000;
        }
      } else {
        ms = remptlist->objects;
        if (nit > 0) {
          nit--;
        }
      }
      autofliplinklevel+=b->fliplinklevelinc;
    } else {
      // All points are removed.
      break;
    }
  } // while (1)

  if (remptlist->objects > 0l) {
    if (b->verbose) {
      printf("  %ld points are not removed !\n", remptlist->objects);
    }
  }

  b->fliplinklevel = bak_fliplinklevel;
  delete remptlist;
}